

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_CryptoPro_C_ParamSet.c
# Opt level: O2

void fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(uint64_t *out1,uint64_t *arg1,uint64_t *arg2)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  ulong uVar63;
  ulong uVar64;
  ulong uVar65;
  ulong uVar66;
  ulong uVar67;
  ulong uVar68;
  ulong uVar69;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  long lVar73;
  ulong uVar74;
  ulong uVar75;
  ulong uVar76;
  ulong uVar77;
  ulong uVar78;
  ulong uVar79;
  ulong uVar80;
  
  uVar74 = *arg1;
  uVar1 = arg2[3];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar1;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar74;
  uVar53 = SUB168(auVar2 * auVar34,0);
  uVar59 = arg2[2];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar59;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar74;
  uVar61 = SUB168(auVar3 * auVar35,8);
  uVar54 = SUB168(auVar3 * auVar35,0);
  uVar69 = *arg2;
  uVar60 = arg2[1];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar60;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar74;
  uVar62 = SUB168(auVar4 * auVar36,8);
  uVar55 = SUB168(auVar4 * auVar36,0);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar69;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uVar74;
  uVar63 = SUB168(auVar5 * auVar37,8);
  uVar56 = SUB168(auVar5 * auVar37,0);
  uVar74 = uVar62 + uVar54;
  uVar72 = uVar74 + CARRY8(uVar63,uVar55);
  uVar74 = (ulong)(CARRY8(uVar62,uVar54) || CARRY8(uVar74,(ulong)CARRY8(uVar63,uVar55)));
  uVar54 = uVar61 + uVar53;
  uVar70 = uVar54 + uVar74;
  uVar77 = SUB168(auVar2 * auVar34,8) + (ulong)(CARRY8(uVar61,uVar53) || CARRY8(uVar54,uVar74));
  uVar74 = uVar56 * -0x209193d38d83e893;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar74;
  uVar64 = SUB168(auVar6 * ZEXT816(0x9b9f605f5a858107),8);
  uVar57 = SUB168(auVar6 * ZEXT816(0x9b9f605f5a858107),0);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar74;
  uVar65 = SUB168(auVar7 * ZEXT816(0xab1ec85e6b41c8aa),8);
  uVar61 = SUB168(auVar7 * ZEXT816(0xab1ec85e6b41c8aa),0);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar74;
  uVar62 = SUB168(auVar8 * ZEXT816(0xcf846e86789051d3),8);
  uVar54 = SUB168(auVar8 * ZEXT816(0xcf846e86789051d3),0);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar74;
  uVar53 = SUB168(auVar9 * ZEXT816(0x7998f7b9022d759b),8);
  uVar58 = SUB168(auVar9 * ZEXT816(0x7998f7b9022d759b),0);
  uVar74 = uVar53 + uVar54;
  uVar54 = (ulong)CARRY8(uVar53,uVar54);
  uVar53 = uVar62 + uVar61;
  uVar79 = uVar53 + uVar54;
  uVar53 = (ulong)(CARRY8(uVar62,uVar61) || CARRY8(uVar53,uVar54));
  uVar62 = uVar65 + uVar57;
  uVar75 = uVar62 + uVar53;
  uVar54 = (ulong)(CARRY8(uVar63 + uVar55,uVar74) ||
                  CARRY8(uVar63 + uVar55 + uVar74,(ulong)CARRY8(uVar58,uVar56)));
  uVar61 = uVar79 + uVar72;
  uVar80 = uVar61 + uVar54;
  uVar54 = (ulong)(CARRY8(uVar79,uVar72) || CARRY8(uVar61,uVar54));
  uVar61 = uVar75 + uVar70;
  uVar76 = uVar61 + uVar54;
  uVar61 = (ulong)(CARRY8(uVar75,uVar70) || CARRY8(uVar61,uVar54));
  uVar78 = uVar77 + uVar61;
  uVar54 = arg1[1];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar1;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = uVar54;
  uVar72 = SUB168(auVar10 * auVar38,0);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar59;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = uVar54;
  uVar66 = SUB168(auVar11 * auVar39,8);
  uVar75 = SUB168(auVar11 * auVar39,0);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar60;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = uVar54;
  uVar67 = SUB168(auVar12 * auVar40,8);
  uVar79 = SUB168(auVar12 * auVar40,0);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar69;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = uVar54;
  auVar13 = auVar13 * auVar41;
  uVar68 = auVar13._8_8_ + uVar79;
  uVar54 = (ulong)CARRY8(auVar13._8_8_,uVar79);
  uVar70 = uVar67 + uVar75;
  uVar71 = uVar70 + uVar54;
  uVar54 = (ulong)(CARRY8(uVar67,uVar75) || CARRY8(uVar70,uVar54));
  uVar70 = uVar66 + uVar72;
  uVar75 = uVar70 + uVar54;
  uVar74 = uVar63 + uVar55 + (ulong)CARRY8(uVar58,uVar56) + uVar74;
  auVar50._8_8_ = uVar79;
  auVar50._0_8_ = uVar74;
  uVar67 = SUB168(auVar10 * auVar38,8) + (ulong)(CARRY8(uVar66,uVar72) || CARRY8(uVar70,uVar54));
  uVar54 = (ulong)(CARRY8(uVar65,uVar57) || CARRY8(uVar62,uVar53));
  uVar53 = uVar78 + uVar64;
  uVar62 = uVar53 + uVar54;
  uVar79 = (ulong)CARRY8(uVar77,uVar61);
  uVar53 = (ulong)(CARRY8(uVar78,uVar64) || CARRY8(uVar53,uVar54));
  uVar70 = uVar79 + uVar67;
  uVar63 = uVar70 + uVar53;
  lVar73 = SUB168(auVar13 + auVar50,8);
  uVar66 = SUB168(auVar13 + auVar50,0);
  uVar74 = (ulong)(CARRY8(uVar68,uVar80) ||
                  CARRY8(uVar68 + uVar80,(ulong)CARRY8(uVar74,auVar13._0_8_)));
  uVar54 = uVar71 + uVar76;
  uVar65 = uVar54 + uVar74;
  uVar74 = (ulong)(CARRY8(uVar71,uVar76) || CARRY8(uVar54,uVar74));
  uVar54 = uVar62 + uVar75;
  uVar71 = uVar54 + uVar74;
  uVar61 = (ulong)(CARRY8(uVar62,uVar75) || CARRY8(uVar54,uVar74));
  uVar64 = uVar63 + uVar61;
  uVar54 = uVar66 * -0x209193d38d83e893;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar54;
  uVar72 = SUB168(auVar14 * ZEXT816(0x9b9f605f5a858107),8);
  uVar57 = SUB168(auVar14 * ZEXT816(0x9b9f605f5a858107),0);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar54;
  uVar75 = SUB168(auVar15 * ZEXT816(0xab1ec85e6b41c8aa),8);
  uVar55 = SUB168(auVar15 * ZEXT816(0xab1ec85e6b41c8aa),0);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar54;
  uVar56 = SUB168(auVar16 * ZEXT816(0xcf846e86789051d3),8);
  uVar74 = SUB168(auVar16 * ZEXT816(0xcf846e86789051d3),0);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar54;
  uVar62 = SUB168(auVar17 * ZEXT816(0x7998f7b9022d759b),8);
  uVar58 = SUB168(auVar17 * ZEXT816(0x7998f7b9022d759b),0);
  uVar54 = uVar62 + uVar74;
  uVar74 = (ulong)CARRY8(uVar62,uVar74);
  uVar62 = uVar56 + uVar55;
  uVar76 = uVar62 + uVar74;
  uVar62 = (ulong)(CARRY8(uVar56,uVar55) || CARRY8(uVar62,uVar74));
  uVar55 = uVar75 + uVar57;
  uVar68 = uVar55 + uVar62;
  uVar74 = lVar73 + uVar80;
  uVar74 = (ulong)(CARRY8(uVar74,uVar54) || CARRY8(uVar74 + uVar54,(ulong)CARRY8(uVar66,uVar58)));
  uVar56 = uVar76 + uVar65;
  uVar77 = uVar56 + uVar74;
  uVar74 = (ulong)(CARRY8(uVar76,uVar65) || CARRY8(uVar56,uVar74));
  uVar56 = uVar68 + uVar71;
  uVar65 = uVar56 + uVar74;
  uVar74 = (ulong)(CARRY8(uVar68,uVar71) || CARRY8(uVar56,uVar74));
  uVar56 = uVar64 + uVar74;
  uVar62 = (ulong)(CARRY8(uVar75,uVar57) || CARRY8(uVar55,uVar62));
  uVar55 = uVar56 + uVar72;
  uVar75 = uVar55 + uVar62;
  uVar57 = (ulong)(CARRY8(uVar79,uVar67) || CARRY8(uVar70,uVar53)) +
           (ulong)CARRY8(uVar64,uVar74) + (ulong)(CARRY8(uVar56,uVar72) || CARRY8(uVar55,uVar62)) +
           (ulong)CARRY8(uVar63,uVar61);
  uVar74 = arg1[2];
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar1;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = uVar74;
  uVar61 = SUB168(auVar18 * auVar42,0);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar59;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = uVar74;
  uVar70 = SUB168(auVar19 * auVar43,8);
  uVar62 = SUB168(auVar19 * auVar43,0);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar60;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = uVar74;
  uVar55 = SUB168(auVar20 * auVar44,8);
  uVar53 = SUB168(auVar20 * auVar44,0);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar69;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uVar74;
  auVar21 = auVar21 * auVar45;
  uVar54 = lVar73 + uVar80 + (ulong)CARRY8(uVar58,uVar66) + uVar54;
  auVar51._8_8_ = uVar53;
  auVar51._0_8_ = uVar54;
  uVar56 = auVar21._8_8_ + uVar53;
  uVar74 = (ulong)CARRY8(auVar21._8_8_,uVar53);
  uVar53 = uVar55 + uVar62;
  uVar58 = uVar53 + uVar74;
  uVar74 = (ulong)(CARRY8(uVar55,uVar62) || CARRY8(uVar53,uVar74));
  uVar53 = uVar70 + uVar61;
  uVar62 = uVar53 + uVar74;
  uVar64 = SUB168(auVar18 * auVar42,8) + (ulong)(CARRY8(uVar70,uVar61) || CARRY8(uVar53,uVar74));
  lVar73 = SUB168(auVar21 + auVar51,8);
  uVar66 = SUB168(auVar21 + auVar51,0);
  uVar74 = (ulong)(CARRY8(uVar56,uVar77) ||
                  CARRY8(uVar56 + uVar77,(ulong)CARRY8(uVar54,auVar21._0_8_)));
  uVar54 = uVar58 + uVar65;
  uVar63 = uVar54 + uVar74;
  uVar74 = (ulong)(CARRY8(uVar58,uVar65) || CARRY8(uVar54,uVar74));
  uVar54 = uVar62 + uVar75;
  uVar79 = uVar54 + uVar74;
  uVar53 = (ulong)(CARRY8(uVar62,uVar75) || CARRY8(uVar54,uVar74));
  uVar61 = uVar64 + uVar57;
  uVar65 = uVar61 + uVar53;
  uVar54 = uVar66 * -0x209193d38d83e893;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar54;
  uVar70 = SUB168(auVar22 * ZEXT816(0x9b9f605f5a858107),0);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar54;
  uVar58 = SUB168(auVar23 * ZEXT816(0xab1ec85e6b41c8aa),8);
  uVar55 = SUB168(auVar23 * ZEXT816(0xab1ec85e6b41c8aa),0);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar54;
  uVar72 = SUB168(auVar24 * ZEXT816(0xcf846e86789051d3),8);
  uVar74 = SUB168(auVar24 * ZEXT816(0xcf846e86789051d3),0);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar54;
  uVar62 = SUB168(auVar25 * ZEXT816(0x7998f7b9022d759b),8);
  uVar56 = SUB168(auVar25 * ZEXT816(0x7998f7b9022d759b),0);
  uVar54 = uVar62 + uVar74;
  uVar74 = (ulong)CARRY8(uVar62,uVar74);
  uVar62 = uVar72 + uVar55;
  uVar75 = uVar62 + uVar74;
  uVar74 = (ulong)(CARRY8(uVar72,uVar55) || CARRY8(uVar62,uVar74));
  uVar62 = uVar58 + uVar70;
  uVar55 = uVar62 + uVar74;
  uVar70 = SUB168(auVar22 * ZEXT816(0x9b9f605f5a858107),8) +
           (ulong)(CARRY8(uVar58,uVar70) || CARRY8(uVar62,uVar74));
  uVar74 = lVar73 + uVar77;
  uVar74 = (ulong)(CARRY8(uVar74,uVar54) || CARRY8(uVar74 + uVar54,(ulong)CARRY8(uVar66,uVar56)));
  uVar62 = uVar75 + uVar63;
  uVar58 = uVar62 + uVar74;
  uVar74 = (ulong)(CARRY8(uVar75,uVar63) || CARRY8(uVar62,uVar74));
  uVar62 = uVar55 + uVar79;
  uVar75 = uVar62 + uVar74;
  uVar74 = (ulong)(CARRY8(uVar55,uVar79) || CARRY8(uVar62,uVar74));
  uVar62 = uVar70 + uVar65;
  uVar55 = uVar62 + uVar74;
  uVar63 = (ulong)(CARRY8(uVar70,uVar65) || CARRY8(uVar62,uVar74)) +
           (ulong)(CARRY8(uVar64,uVar57) || CARRY8(uVar61,uVar53));
  uVar74 = arg1[3];
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar1;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = uVar74;
  uVar53 = SUB168(auVar26 * auVar46,0);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar59;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = uVar74;
  uVar61 = SUB168(auVar27 * auVar47,8);
  uVar59 = SUB168(auVar27 * auVar47,0);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar60;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar74;
  uVar62 = SUB168(auVar28 * auVar48,8);
  uVar60 = SUB168(auVar28 * auVar48,0);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar69;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = uVar74;
  auVar29 = auVar29 * auVar49;
  uVar69 = auVar29._8_8_ + uVar60;
  uVar74 = (ulong)CARRY8(auVar29._8_8_,uVar60);
  uVar1 = uVar62 + uVar59;
  uVar70 = uVar1 + uVar74;
  uVar74 = (ulong)(CARRY8(uVar62,uVar59) || CARRY8(uVar1,uVar74));
  uVar1 = uVar61 + uVar53;
  uVar59 = uVar1 + uVar74;
  uVar54 = lVar73 + uVar77 + (ulong)CARRY8(uVar56,uVar66) + uVar54;
  auVar52._8_8_ = uVar60;
  auVar52._0_8_ = uVar54;
  uVar79 = SUB168(auVar26 * auVar46,8) + (ulong)(CARRY8(uVar61,uVar53) || CARRY8(uVar1,uVar74));
  lVar73 = SUB168(auVar29 + auVar52,8);
  uVar56 = SUB168(auVar29 + auVar52,0);
  uVar74 = (ulong)(CARRY8(uVar69,uVar58) ||
                  CARRY8(uVar69 + uVar58,(ulong)CARRY8(uVar54,auVar29._0_8_)));
  uVar54 = uVar70 + uVar75;
  uVar72 = uVar54 + uVar74;
  uVar74 = (ulong)(CARRY8(uVar70,uVar75) || CARRY8(uVar54,uVar74));
  uVar54 = uVar59 + uVar55;
  uVar57 = uVar54 + uVar74;
  uVar54 = (ulong)(CARRY8(uVar59,uVar55) || CARRY8(uVar54,uVar74));
  uVar1 = uVar79 + uVar63;
  uVar75 = uVar1 + uVar54;
  uVar59 = uVar56 * -0x209193d38d83e893;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar59;
  uVar69 = SUB168(auVar30 * ZEXT816(0x9b9f605f5a858107),0);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar59;
  uVar61 = SUB168(auVar31 * ZEXT816(0xab1ec85e6b41c8aa),8);
  uVar60 = SUB168(auVar31 * ZEXT816(0xab1ec85e6b41c8aa),0);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar59;
  uVar62 = SUB168(auVar32 * ZEXT816(0xcf846e86789051d3),8);
  uVar74 = SUB168(auVar32 * ZEXT816(0xcf846e86789051d3),0);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar59;
  uVar59 = SUB168(auVar33 * ZEXT816(0x7998f7b9022d759b),8);
  uVar53 = SUB168(auVar33 * ZEXT816(0x7998f7b9022d759b),0);
  uVar70 = uVar59 + uVar74;
  uVar74 = (ulong)CARRY8(uVar59,uVar74);
  uVar59 = uVar62 + uVar60;
  uVar55 = uVar59 + uVar74;
  uVar74 = (ulong)(CARRY8(uVar62,uVar60) || CARRY8(uVar59,uVar74));
  uVar59 = uVar61 + uVar69;
  uVar60 = uVar59 + uVar74;
  uVar62 = SUB168(auVar30 * ZEXT816(0x9b9f605f5a858107),8) +
           (ulong)(CARRY8(uVar61,uVar69) || CARRY8(uVar59,uVar74));
  uVar74 = lVar73 + uVar58;
  uVar74 = (ulong)(CARRY8(uVar74,uVar70) || CARRY8(uVar74 + uVar70,(ulong)CARRY8(uVar56,uVar53)));
  uVar59 = uVar55 + uVar72;
  uVar69 = uVar59 + uVar74;
  uVar74 = (ulong)(CARRY8(uVar55,uVar72) || CARRY8(uVar59,uVar74));
  uVar59 = uVar60 + uVar57;
  uVar61 = uVar59 + uVar74;
  uVar74 = (ulong)(CARRY8(uVar60,uVar57) || CARRY8(uVar59,uVar74));
  uVar59 = uVar62 + uVar75;
  uVar60 = uVar59 + uVar74;
  uVar70 = uVar70 + lVar73 + uVar58 + (ulong)CARRY8(uVar53,uVar56);
  uVar53 = (ulong)(byte)-((0x7998f7b9022d759a < uVar70) + -1);
  uVar55 = uVar69 - uVar53;
  uVar53 = (ulong)(byte)-((-1 - (uVar69 < uVar53)) + (0xcf846e86789051d2 < uVar55));
  uVar56 = uVar61 - uVar53;
  uVar53 = (ulong)(byte)-((-1 - (uVar61 < uVar53)) + (0xab1ec85e6b41c8a9 < uVar56));
  uVar57 = uVar60 - uVar53;
  uVar74 = -(ulong)((byte)((CARRY8(uVar62,uVar75) || CARRY8(uVar59,uVar74)) +
                          (CARRY8(uVar79,uVar63) || CARRY8(uVar1,uVar54))) <
                   (byte)-((-1 - (uVar60 < uVar53)) + (0x9b9f605f5a858106 < uVar57)));
  uVar54 = ~uVar74;
  *out1 = uVar70 + 0x86670846fdd28a65 & uVar54 | uVar70 & uVar74;
  out1[1] = uVar55 + 0x307b9179876fae2d & uVar54 | uVar69 & uVar74;
  out1[2] = uVar56 + 0x54e137a194be3756 & uVar54 | uVar61 & uVar74;
  out1[3] = uVar54 & uVar57 + 0x64609fa0a57a7ef9 | uVar74 & uVar60;
  return;
}

Assistant:

static void fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(
    uint64_t out1[4], const uint64_t arg1[4], const uint64_t arg2[4]) {
    uint64_t x1;
    uint64_t x2;
    uint64_t x3;
    uint64_t x4;
    uint64_t x5;
    uint64_t x6;
    uint64_t x7;
    uint64_t x8;
    uint64_t x9;
    uint64_t x10;
    uint64_t x11;
    uint64_t x12;
    uint64_t x13;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x14;
    uint64_t x15;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x16;
    uint64_t x17;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x18;
    uint64_t x19;
    uint64_t x20;
    uint64_t x21;
    uint64_t x22;
    uint64_t x23;
    uint64_t x24;
    uint64_t x25;
    uint64_t x26;
    uint64_t x27;
    uint64_t x28;
    uint64_t x29;
    uint64_t x30;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x31;
    uint64_t x32;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x33;
    uint64_t x34;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x35;
    uint64_t x36;
    uint64_t x37;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x38;
    uint64_t x39;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x40;
    uint64_t x41;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x42;
    uint64_t x43;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x44;
    uint64_t x45;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x46;
    uint64_t x47;
    uint64_t x48;
    uint64_t x49;
    uint64_t x50;
    uint64_t x51;
    uint64_t x52;
    uint64_t x53;
    uint64_t x54;
    uint64_t x55;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x56;
    uint64_t x57;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x58;
    uint64_t x59;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x60;
    uint64_t x61;
    uint64_t x62;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x63;
    uint64_t x64;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x65;
    uint64_t x66;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x67;
    uint64_t x68;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x69;
    uint64_t x70;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x71;
    uint64_t x72;
    uint64_t x73;
    uint64_t x74;
    uint64_t x75;
    uint64_t x76;
    uint64_t x77;
    uint64_t x78;
    uint64_t x79;
    uint64_t x80;
    uint64_t x81;
    uint64_t x82;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x83;
    uint64_t x84;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x85;
    uint64_t x86;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x87;
    uint64_t x88;
    uint64_t x89;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x90;
    uint64_t x91;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x92;
    uint64_t x93;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x94;
    uint64_t x95;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x96;
    uint64_t x97;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x98;
    uint64_t x99;
    uint64_t x100;
    uint64_t x101;
    uint64_t x102;
    uint64_t x103;
    uint64_t x104;
    uint64_t x105;
    uint64_t x106;
    uint64_t x107;
    uint64_t x108;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x109;
    uint64_t x110;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x111;
    uint64_t x112;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x113;
    uint64_t x114;
    uint64_t x115;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x116;
    uint64_t x117;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x118;
    uint64_t x119;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x120;
    uint64_t x121;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x122;
    uint64_t x123;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x124;
    uint64_t x125;
    uint64_t x126;
    uint64_t x127;
    uint64_t x128;
    uint64_t x129;
    uint64_t x130;
    uint64_t x131;
    uint64_t x132;
    uint64_t x133;
    uint64_t x134;
    uint64_t x135;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x136;
    uint64_t x137;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x138;
    uint64_t x139;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x140;
    uint64_t x141;
    uint64_t x142;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x143;
    uint64_t x144;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x145;
    uint64_t x146;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x147;
    uint64_t x148;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x149;
    uint64_t x150;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x151;
    uint64_t x152;
    uint64_t x153;
    uint64_t x154;
    uint64_t x155;
    uint64_t x156;
    uint64_t x157;
    uint64_t x158;
    uint64_t x159;
    uint64_t x160;
    uint64_t x161;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x162;
    uint64_t x163;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x164;
    uint64_t x165;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x166;
    uint64_t x167;
    uint64_t x168;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x169;
    uint64_t x170;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x171;
    uint64_t x172;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x173;
    uint64_t x174;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x175;
    uint64_t x176;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x177;
    uint64_t x178;
    uint64_t x179;
    uint64_t x180;
    uint64_t x181;
    uint64_t x182;
    uint64_t x183;
    uint64_t x184;
    uint64_t x185;
    uint64_t x186;
    uint64_t x187;
    uint64_t x188;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x189;
    uint64_t x190;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x191;
    uint64_t x192;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x193;
    uint64_t x194;
    uint64_t x195;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x196;
    uint64_t x197;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x198;
    uint64_t x199;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x200;
    uint64_t x201;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x202;
    uint64_t x203;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x204;
    uint64_t x205;
    uint64_t x206;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x207;
    uint64_t x208;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x209;
    uint64_t x210;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x211;
    uint64_t x212;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x213;
    uint64_t x214;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x215;
    uint64_t x216;
    uint64_t x217;
    uint64_t x218;
    uint64_t x219;
    x1 = (arg1[1]);
    x2 = (arg1[2]);
    x3 = (arg1[3]);
    x4 = (arg1[0]);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x5, &x6, x4,
                                                         (arg2[3]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x7, &x8, x4,
                                                         (arg2[2]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x9, &x10, x4,
                                                         (arg2[1]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x11, &x12, x4,
                                                         (arg2[0]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x13, &x14, 0x0,
                                                              x12, x9);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x15, &x16, x14,
                                                              x10, x7);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x17, &x18, x16,
                                                              x8, x5);
    x19 = (x18 + x6);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x20, &x21, x11, UINT64_C(0xdf6e6c2c727c176d));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x22, &x23, x20, UINT64_C(0x9b9f605f5a858107));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x24, &x25, x20, UINT64_C(0xab1ec85e6b41c8aa));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x26, &x27, x20, UINT64_C(0xcf846e86789051d3));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x28, &x29, x20, UINT64_C(0x7998f7b9022d759b));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x30, &x31, 0x0,
                                                              x29, x26);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x32, &x33, x31,
                                                              x27, x24);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x34, &x35, x33,
                                                              x25, x22);
    x36 = (x35 + x23);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x37, &x38, 0x0,
                                                              x11, x28);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x39, &x40, x38,
                                                              x13, x30);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x41, &x42, x40,
                                                              x15, x32);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x43, &x44, x42,
                                                              x17, x34);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x45, &x46, x44,
                                                              x19, x36);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x47, &x48, x1,
                                                         (arg2[3]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x49, &x50, x1,
                                                         (arg2[2]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x51, &x52, x1,
                                                         (arg2[1]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x53, &x54, x1,
                                                         (arg2[0]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x55, &x56, 0x0,
                                                              x54, x51);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x57, &x58, x56,
                                                              x52, x49);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x59, &x60, x58,
                                                              x50, x47);
    x61 = (x60 + x48);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x62, &x63, 0x0,
                                                              x39, x53);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x64, &x65, x63,
                                                              x41, x55);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x66, &x67, x65,
                                                              x43, x57);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x68, &x69, x67,
                                                              x45, x59);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x70, &x71, x69,
                                                              x46, x61);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x72, &x73, x62, UINT64_C(0xdf6e6c2c727c176d));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x74, &x75, x72, UINT64_C(0x9b9f605f5a858107));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x76, &x77, x72, UINT64_C(0xab1ec85e6b41c8aa));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x78, &x79, x72, UINT64_C(0xcf846e86789051d3));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x80, &x81, x72, UINT64_C(0x7998f7b9022d759b));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x82, &x83, 0x0,
                                                              x81, x78);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x84, &x85, x83,
                                                              x79, x76);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x86, &x87, x85,
                                                              x77, x74);
    x88 = (x87 + x75);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x89, &x90, 0x0,
                                                              x62, x80);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x91, &x92, x90,
                                                              x64, x82);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x93, &x94, x92,
                                                              x66, x84);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x95, &x96, x94,
                                                              x68, x86);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x97, &x98, x96,
                                                              x70, x88);
    x99 = ((uint64_t)x98 + x71);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x100, &x101, x2,
                                                         (arg2[3]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x102, &x103, x2,
                                                         (arg2[2]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x104, &x105, x2,
                                                         (arg2[1]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x106, &x107, x2,
                                                         (arg2[0]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x108, &x109, 0x0,
                                                              x107, x104);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x110, &x111,
                                                              x109, x105, x102);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x112, &x113,
                                                              x111, x103, x100);
    x114 = (x113 + x101);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x115, &x116, 0x0,
                                                              x91, x106);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x117, &x118,
                                                              x116, x93, x108);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x119, &x120,
                                                              x118, x95, x110);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x121, &x122,
                                                              x120, x97, x112);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x123, &x124,
                                                              x122, x99, x114);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x125, &x126, x115, UINT64_C(0xdf6e6c2c727c176d));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x127, &x128, x125, UINT64_C(0x9b9f605f5a858107));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x129, &x130, x125, UINT64_C(0xab1ec85e6b41c8aa));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x131, &x132, x125, UINT64_C(0xcf846e86789051d3));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x133, &x134, x125, UINT64_C(0x7998f7b9022d759b));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x135, &x136, 0x0,
                                                              x134, x131);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x137, &x138,
                                                              x136, x132, x129);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x139, &x140,
                                                              x138, x130, x127);
    x141 = (x140 + x128);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x142, &x143, 0x0,
                                                              x115, x133);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x144, &x145,
                                                              x143, x117, x135);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x146, &x147,
                                                              x145, x119, x137);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x148, &x149,
                                                              x147, x121, x139);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x150, &x151,
                                                              x149, x123, x141);
    x152 = ((uint64_t)x151 + x124);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x153, &x154, x3,
                                                         (arg2[3]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x155, &x156, x3,
                                                         (arg2[2]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x157, &x158, x3,
                                                         (arg2[1]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x159, &x160, x3,
                                                         (arg2[0]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x161, &x162, 0x0,
                                                              x160, x157);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x163, &x164,
                                                              x162, x158, x155);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x165, &x166,
                                                              x164, x156, x153);
    x167 = (x166 + x154);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x168, &x169, 0x0,
                                                              x144, x159);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x170, &x171,
                                                              x169, x146, x161);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x172, &x173,
                                                              x171, x148, x163);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x174, &x175,
                                                              x173, x150, x165);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x176, &x177,
                                                              x175, x152, x167);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x178, &x179, x168, UINT64_C(0xdf6e6c2c727c176d));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x180, &x181, x178, UINT64_C(0x9b9f605f5a858107));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x182, &x183, x178, UINT64_C(0xab1ec85e6b41c8aa));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x184, &x185, x178, UINT64_C(0xcf846e86789051d3));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x186, &x187, x178, UINT64_C(0x7998f7b9022d759b));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x188, &x189, 0x0,
                                                              x187, x184);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x190, &x191,
                                                              x189, x185, x182);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x192, &x193,
                                                              x191, x183, x180);
    x194 = (x193 + x181);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x195, &x196, 0x0,
                                                              x168, x186);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x197, &x198,
                                                              x196, x170, x188);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x199, &x200,
                                                              x198, x172, x190);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x201, &x202,
                                                              x200, x174, x192);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x203, &x204,
                                                              x202, x176, x194);
    x205 = ((uint64_t)x204 + x177);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(
        &x206, &x207, 0x0, x197, UINT64_C(0x7998f7b9022d759b));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(
        &x208, &x209, x207, x199, UINT64_C(0xcf846e86789051d3));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(
        &x210, &x211, x209, x201, UINT64_C(0xab1ec85e6b41c8aa));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(
        &x212, &x213, x211, x203, UINT64_C(0x9b9f605f5a858107));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(&x214, &x215,
                                                               x213, x205, 0x0);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64(&x216, x215, x206,
                                                            x197);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64(&x217, x215, x208,
                                                            x199);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64(&x218, x215, x210,
                                                            x201);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64(&x219, x215, x212,
                                                            x203);
    out1[0] = x216;
    out1[1] = x217;
    out1[2] = x218;
    out1[3] = x219;
}